

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

tuple<int,_int,_int> __thiscall
Display::getMaximumFieldsize(Display *this,int window_width,int window_height,int mine_count)

{
  bool bVar1;
  runtime_error *this_00;
  __type _Var2;
  tuple<int,_int,_int> tVar3;
  int local_1c0;
  int exponent;
  string local_198;
  string local_178;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  tuple<int&,int&> local_48 [16];
  undefined1 local_38 [16];
  int required_height;
  int required_width;
  int count;
  int height;
  int width;
  int mine_count_local;
  int window_height_local;
  int window_width_local;
  
  count = 1;
  required_width = 1;
  required_height = mine_count;
  height = mine_count;
  width = window_height;
  mine_count_local = window_width;
  _window_height_local = this;
  bVar1 = isWindowSizeSufficient(1,1,mine_count,window_width,window_height);
  if (!bVar1) {
    getRequiredWindowSize((Display *)local_38,count,required_width,required_height);
    std::tie<int,int>((int *)local_48,(int *)(local_38 + 0xc));
    std::tuple<int&,int&>::operator=(local_48,(tuple<int,_int> *)local_38);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_148,mine_count_local);
    std::operator+(&local_128,"Can\'t display any minefield on this size (",&local_148);
    std::operator+(&local_108,&local_128,"x");
    std::__cxx11::to_string(&local_178,width);
    std::operator+(&local_e8,&local_108,&local_178);
    std::operator+(&local_c8,&local_e8,"), minimum required: ");
    std::__cxx11::to_string(&local_198,local_38._12_4_);
    std::operator+(&local_a8,&local_c8,&local_198);
    std::operator+(&local_88,&local_a8,"x");
    std::__cxx11::to_string((string *)&exponent,local_38._8_4_);
    std::operator+(&local_68,&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exponent);
    std::runtime_error::runtime_error(this_00,(string *)&local_68);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  while (bVar1 = isWindowSizeSufficient(count,required_width,required_height,mine_count_local,width)
        , bVar1) {
    required_width = required_width + 1;
  }
  required_width = required_width + -1;
  while (bVar1 = isWindowSizeSufficient(count,required_width,required_height,mine_count_local,width)
        , bVar1) {
    count = count + 1;
  }
  count = count + -1;
  local_1c0 = 0;
  while ((bVar1 = isWindowSizeSufficient
                            (count,required_width,required_height,mine_count_local,width),
         bVar1 && required_height <= count * required_width &&
         (local_1c0 = local_1c0 + 1, local_1c0 < 10))) {
    _Var2 = std::pow<int,int>(10,local_1c0);
    required_height = (int)_Var2;
  }
  required_height = required_height + -1;
  if (count * required_width < required_height) {
    required_height = count * required_width;
  }
  tVar3 = std::make_tuple<int&,int&,int&>((int *)this,&count,&required_width);
  tVar3.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> =
       (_Tuple_impl<1UL,_int,_int>)this;
  return (tuple<int,_int,_int>)tVar3.super__Tuple_impl<0UL,_int,_int,_int>;
}

Assistant:

std::tuple<int, int, int> Display::getMaximumFieldsize(int window_width, int window_height, int mine_count) {
    int width = 1;
    int height = 1;
    int count = mine_count;

    if (! isWindowSizeSufficient(width, height, count, window_width, window_height)) {
        int required_width, required_height;
        std::tie(required_width, required_height) = Display::getRequiredWindowSize(width, height, count);
        throw std::runtime_error("Can't display any minefield on this size (" + std::to_string(window_width) + "x" + std::to_string(window_height) + "), minimum required: " + std::to_string(required_width) + "x" + std::to_string(required_height));
    }

    // get max y
    while (isWindowSizeSufficient(width, height, count, window_width, window_height)) {
        height++;
    }
    // height is now one too much
    height--;

    // get max x
    while (isWindowSizeSufficient(width, height, count, window_width, window_height)) {
        width++;
    }
    // width is now one too much
    width--;

    // now get max. minecount
    
    int exponent = 0;
    while (isWindowSizeSufficient(width, height, count, window_width, window_height) && count <= width * height) {
        exponent++;
        if (std::numeric_limits<int>::digits10 < exponent) {
            break;
        }
        count = std::pow(10, exponent);
    }
    // remove one decimal digit -> is OK
    count--;
    if (count > width * height) {
        count = width * height;
    }

    return std::make_tuple(width, height, count);
}